

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

bool testing::internal::ParseInt32(Message *src_text,char *str,Int32 *value)

{
  Message *pMVar1;
  char *pcVar2;
  String local_80;
  Message local_70;
  Message msg_1;
  undefined1 local_60 [4];
  Int32 result;
  Message local_40;
  Message msg;
  long long_value;
  char *end;
  Int32 *value_local;
  char *str_local;
  Message *src_text_local;
  
  long_value = 0;
  end = (char *)value;
  value_local = (Int32 *)str;
  str_local = (char *)src_text;
  msg.ss_.ptr_ = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )strtol(str,(char **)&long_value,10);
  if (*(char *)long_value == '\0') {
    msg_1.ss_.ptr_._4_4_ = SUB84(msg.ss_.ptr_,0);
    if (((msg.ss_.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          0x7fffffffffffffff) ||
        (msg.ss_.ptr_ ==
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x8000000000000000)) ||
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (long)msg_1.ss_.ptr_._4_4_ != msg.ss_.ptr_)) {
      Message::Message(&local_70);
      pMVar1 = Message::operator<<(&local_70,(char (*) [10])"WARNING: ");
      pMVar1 = Message::operator<<(pMVar1,(Message *)str_local);
      pMVar1 = Message::operator<<(pMVar1,(char (*) [50])
                                          " is expected to be a 32-bit integer, but actually");
      pMVar1 = Message::operator<<(pMVar1,(char (*) [12])" has value ");
      pMVar1 = Message::operator<<(pMVar1,(char **)&value_local);
      Message::operator<<(pMVar1,(char (*) [20])", which overflows.\n");
      Message::GetString((Message *)&local_80);
      pcVar2 = String::c_str(&local_80);
      printf("%s",pcVar2);
      String::~String(&local_80);
      fflush(_stdout);
      src_text_local._7_1_ = 0;
      Message::~Message(&local_70);
    }
    else {
      *(int *)end = msg_1.ss_.ptr_._4_4_;
      src_text_local._7_1_ = 1;
    }
  }
  else {
    Message::Message(&local_40);
    pMVar1 = Message::operator<<(&local_40,(char (*) [10])"WARNING: ");
    pMVar1 = Message::operator<<(pMVar1,(Message *)str_local);
    pMVar1 = Message::operator<<(pMVar1,(char (*) [50])
                                        " is expected to be a 32-bit integer, but actually");
    pMVar1 = Message::operator<<(pMVar1,(char (*) [13])" has value \"");
    pMVar1 = Message::operator<<(pMVar1,(char **)&value_local);
    Message::operator<<(pMVar1,(char (*) [4])"\".\n");
    Message::GetString((Message *)local_60);
    pcVar2 = String::c_str((String *)local_60);
    printf("%s",pcVar2);
    String::~String((String *)local_60);
    fflush(_stdout);
    src_text_local._7_1_ = 0;
    Message::~Message(&local_40);
  }
  return (bool)(src_text_local._7_1_ & 1);
}

Assistant:

bool ParseInt32(const Message& src_text, const char* str, Int32* value) {
  // Parses the environment variable as a decimal integer.
  char* end = NULL;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value \"" << str << "\".\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  // Is the parsed value in the range of an Int32?
  const Int32 result = static_cast<Int32>(long_value);
  if (long_value == LONG_MAX || long_value == LONG_MIN ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
      // The parsed value overflows as an Int32.
      ) {
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value " << str << ", which overflows.\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  *value = result;
  return true;
}